

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test3::writePreamble
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  shaderStage shader_stage_local;
  ostream *stream_local;
  GPUShaderFP64Test3 *this_local;
  
  std::operator<<(stream,"#version 400 core\n\nprecision highp float;\n\n");
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    break;
  case GEOMETRY_SHADER:
    std::operator<<(stream,
                    "layout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n"
                   );
    break;
  case TESS_CONTROL_SHADER:
    std::operator<<(stream,"layout(vertices = 1) out;\n\n");
    break;
  case TESS_EVAL_SHADER:
    std::operator<<(stream,"layout(isolines, point_mode) in;\n\n");
    break;
  case VERTEX_SHADER:
  }
  return;
}

Assistant:

void GPUShaderFP64Test3::writePreamble(std::ostream& stream, shaderStage shader_stage) const
{
	stream << "#version 400 core\n"
			  "\n"
			  "precision highp float;\n"
			  "\n";

	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		break;
	case GEOMETRY_SHADER:
		stream << "layout(points)                   in;\n"
				  "layout(points, max_vertices = 1) out;\n"
				  "\n";
		break;
	case TESS_CONTROL_SHADER:
		stream << "layout(vertices = 1) out;\n"
				  "\n";
		break;
	case TESS_EVAL_SHADER:
		stream << "layout(isolines, point_mode) in;\n"
				  "\n";
		break;
	case VERTEX_SHADER:
		break;
	}
}